

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O1

int P_Set3DFloor(line_t *line,int param,int param2,int alpha)

{
  sector_t *sec2;
  line_t *plVar1;
  side_t *psVar2;
  bool bVar3;
  uint uVar4;
  FDynamicColormap *pFVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  sector_t *sec;
  int iVar11;
  FSectorTagIterator itr;
  FSectorTagIterator local_40;
  ulong local_38;
  
  local_40.searchtag = line->args[0];
  sec2 = line->frontsector;
  if (local_40.searchtag == 0) {
    local_40.start = 0;
  }
  else {
    local_40.start = tagManager.TagHashFirst[(byte)local_40.searchtag];
  }
  uVar4 = FSectorTagIterator::Next(&local_40);
  if (-1 < (int)uVar4) {
    local_38 = (ulong)(param & 3);
    uVar9 = 0x420d;
    if ((param & 4U) == 0) {
      uVar9 = 0xd;
    }
    uVar8 = (param2 & 0x400U) << 0x15 | (param2 & 0x200U) << 0x12;
    do {
      sec = sectors + uVar4;
      uVar10 = (param2 & 1U) << 0x19 | 0x202029;
      uVar4 = 0xff;
      if (param != 4) {
        if (param == 0) {
          if (sec2->linecount < 1) {
            uVar10 = 0x40000f;
            uVar4 = 0xff;
          }
          else {
            uVar10 = 0x40000f;
            uVar4 = 0xff;
            lVar7 = 0;
            do {
              plVar1 = sec2->lines[lVar7];
              bVar3 = true;
              if ((plVar1->special == 0xa1) && (plVar1->frontsector == sec2)) {
                uVar4 = plVar1->args[2];
                uVar6 = uVar10 & 0xfffffffd;
                if ((uVar4 & 1) == 0) {
                  uVar6 = uVar10;
                }
                uVar6 = (uVar4 & 6) << 0x18 | (uVar4 & 8) << 0x19 | uVar6;
                uVar10 = uVar6 | 0x800;
                iVar11 = plVar1->args[1];
                if (99 < plVar1->args[1]) {
                  uVar10 = uVar6;
                  iVar11 = 100;
                }
                if (iVar11 < 1) {
                  iVar11 = 0;
                }
                if ((long)plVar1->args[0] != 0) {
                  uVar10 = uVar10 | 0x20004210;
                  pFVar5 = plVar1->frontsector->ColorMap;
                  pFVar5 = GetSpecialLights((PalEntry)(pFVar5->Color).field_0.field_0,
                                            (PalEntry)
                                            ((anon_union_4_2_12391d7c_for_PalEntry_0 *)
                                            (P_Set3DFloor::vavoomcolors + plVar1->args[0]))->field_0
                                            ,pFVar5->Desaturate);
                  plVar1->frontsector->ColorMap = pFVar5;
                }
                uVar4 = (uint)(iVar11 * 0xff) / 100;
                bVar3 = false;
              }
            } while ((bVar3) && (lVar7 = lVar7 + 1, lVar7 < sec2->linecount));
          }
        }
        else {
          uVar10 = (P_Set3DFloor::defflags[local_38] | uVar9) ^ (param & 0x30U) << 0x15 |
                   param2 << 0xd & 0x40000U |
                   param2 << 0xd & 0x20000U |
                   (param2 & 8U) << 0x10 |
                   (param2 & 4U) << 10 | (param2 & 2U) << 0xf | (param2 & 1U) << 5;
          uVar4 = uVar10 | 0x10000800;
          if ((param2 & 0x40U) == 0) {
            uVar4 = uVar10;
          }
          uVar6 = uVar4 | 0x26000000;
          if ((uVar4 & 2) != 0) {
            uVar6 = uVar4;
          }
          if (-1 < (char)param2) {
            uVar6 = uVar4;
          }
          uVar10 = uVar6 | uVar8;
          iVar11 = line->sidedef[0]->textures[0].texture.texnum;
          uVar4 = -iVar11;
          if (-1 < iVar11) {
            uVar4 = alpha;
          }
          if (0xfe < alpha) {
            uVar4 = alpha;
          }
          if (0xfe < (int)uVar4) {
            uVar4 = 0xff;
          }
          if ((int)uVar4 < 1) {
            uVar4 = 0;
          }
          if (uVar4 != 0xff) {
            if (uVar4 == 0) {
              uVar10 = uVar6 & 0xffffbdf3 | uVar8;
            }
            else {
              uVar10 = uVar10 | 0x800;
            }
          }
        }
      }
      alpha = uVar4;
      P_Add3DFloor(sec,sec2,line,uVar10,alpha);
      uVar4 = FSectorTagIterator::Next(&local_40);
    } while (-1 < (int)uVar4);
  }
  psVar2 = line->sidedef[0];
  if (psVar2->textures[0].texture.texnum < 1) {
    psVar2->textures[0].texture.texnum = 0;
  }
  return (int)psVar2;
}

Assistant:

static int P_Set3DFloor(line_t * line, int param, int param2, int alpha)
{
	int s, i;
	int flags;
	int tag = line->args[0];
	sector_t * sec = line->frontsector, *ss;

	FSectorTagIterator itr(tag);
	while ((s = itr.Next()) >= 0)
	{
		ss = &sectors[s];

		if (param == 0)
		{
			flags = FF_EXISTS | FF_RENDERALL | FF_SOLID | FF_INVERTSECTOR;
			alpha = 255;
			for (i = 0; i < sec->linecount; i++)
			{
				line_t * l = sec->lines[i];

				if (l->special == Sector_SetContents && l->frontsector == sec)
				{
					alpha = clamp<int>(l->args[1], 0, 100);
					if (l->args[2] & 1) flags &= ~FF_SOLID;
					if (l->args[2] & 2) flags |= FF_SEETHROUGH;
					if (l->args[2] & 4) flags |= FF_SHOOTTHROUGH;
					if (l->args[2] & 8) flags |= FF_ADDITIVETRANS;
					if (alpha != 100) flags |= FF_TRANSLUCENT;//|FF_BOTHPLANES|FF_ALLSIDES;
					if (l->args[0])
					{
						// Yes, Vavoom's 3D-floor definitions suck!
						// The content list changed in r1783 of Vavoom to be unified
						// among all its supported games, so it has now ten different
						// values instead of just five.
						static DWORD vavoomcolors[] = { VC_EMPTY,
							VC_WATER, VC_LAVA, VC_NUKAGE, VC_SLIME, VC_HELLSLIME,
							VC_BLOOD, VC_SLUDGE, VC_HAZARD, VC_BOOMWATER };
						flags |= FF_SWIMMABLE | FF_BOTHPLANES | FF_ALLSIDES | FF_FLOOD;

						l->frontsector->ColorMap =
							GetSpecialLights(l->frontsector->ColorMap->Color,
							vavoomcolors[l->args[0]],
							l->frontsector->ColorMap->Desaturate);
					}
					alpha = (alpha * 255) / 100;
					break;
				}
			}
		}
		else if (param == 4)
		{
			flags = FF_EXISTS | FF_RENDERPLANES | FF_INVERTPLANES | FF_NOSHADE | FF_FIX;
			if (param2 & 1) flags |= FF_SEETHROUGH;	// marker for allowing missing texture checks
			alpha = 255;
		}
		else
		{
			static const int defflags[] = { 0,
				FF_SOLID,
				FF_SWIMMABLE | FF_BOTHPLANES | FF_ALLSIDES | FF_SHOOTTHROUGH | FF_SEETHROUGH,
				FF_SHOOTTHROUGH | FF_SEETHROUGH,
			};

			flags = defflags[param & 3] | FF_EXISTS | FF_RENDERALL;

			if (param & 4) flags |= FF_ALLSIDES | FF_BOTHPLANES;
			if (param & 16) flags ^= FF_SEETHROUGH;
			if (param & 32) flags ^= FF_SHOOTTHROUGH;

			if (param2 & 1) flags |= FF_NOSHADE;
			if (param2 & 2) flags |= FF_DOUBLESHADOW;
			if (param2 & 4) flags |= FF_FOG;
			if (param2 & 8) flags |= FF_THINFLOOR;
			if (param2 & 16) flags |= FF_UPPERTEXTURE;
			if (param2 & 32) flags |= FF_LOWERTEXTURE;
			if (param2 & 64) flags |= FF_ADDITIVETRANS | FF_TRANSLUCENT;
			// if flooding is used the floor must be non-solid and is automatically made shootthrough and seethrough
			if ((param2 & 128) && !(flags & FF_SOLID)) flags |= FF_FLOOD | FF_SEETHROUGH | FF_SHOOTTHROUGH;
			if (param2 & 512) flags |= FF_FADEWALLS;
			if (param2&1024) flags |= FF_RESET;
			FTextureID tex = line->sidedef[0]->GetTexture(side_t::top);
			if (!tex.Exists() && alpha < 255)
			{
				alpha = -tex.GetIndex();
			}
			alpha = clamp(alpha, 0, 255);
			if (alpha == 0) flags &= ~(FF_RENDERALL | FF_BOTHPLANES | FF_ALLSIDES);
			else if (alpha != 255) flags |= FF_TRANSLUCENT;

		}
		P_Add3DFloor(ss, sec, line, flags, alpha);
	}
	// To be 100% safe this should be done even if the alpha by texture value isn't used.
	if (!line->sidedef[0]->GetTexture(side_t::top).isValid())
		line->sidedef[0]->SetTexture(side_t::top, FNullTextureID());
	return 1;
}